

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness
          (DescriptorBuilder *this,string_view message_name,DescriptorProto *message,
          Descriptor *descriptor,bool use_custom_names)

{
  code *pcVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  byte bVar4;
  bool bVar5;
  char cVar6;
  ushort uVar7;
  uint32_t uVar8;
  uint uVar9;
  void **ppvVar10;
  size_t *psVar11;
  size_t sVar12;
  anon_union_8_1_a8a14541_for_iterator_2 aVar13;
  reference ppVar14;
  byte bVar15;
  anon_union_8_1_a8a14541_for_iterator_2 aVar16;
  char *pcVar17;
  undefined8 uVar18;
  string sVar19;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_00;
  ctrl_t *pcVar20;
  undefined7 in_register_00000089;
  ctrl_t *ctrl;
  ulong uVar21;
  undefined4 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  __m128i match;
  undefined1 auVar26 [16];
  code cVar27;
  code cVar30;
  code cVar31;
  code cVar32;
  code cVar33;
  code cVar34;
  code cVar35;
  code cVar36;
  code cVar37;
  code cVar38;
  code cVar39;
  code cVar40;
  code cVar41;
  code cVar42;
  code cVar43;
  code cVar44;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  string_view v;
  string_view v_00;
  string_view input;
  FindInfo FVar45;
  iterator iVar46;
  iterator iVar47;
  anon_class_24_3_4f82d86e make_error;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
  name_to_field;
  JsonNameDetails details;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>::iterator,_bool>
  it_inserted;
  anon_union_8_1_a8a14541_for_iterator_2 local_1b0;
  anon_union_8_1_a8a14541_for_iterator_2 *local_1a8;
  anon_union_8_1_a8a14541_for_iterator_2 local_1a0;
  undefined8 uStack_198;
  undefined4 local_18c;
  undefined1 local_188 [16];
  HeapOrSoo local_178;
  anon_union_8_1_a8a14541_for_iterator_2 local_168;
  anon_union_8_1_a8a14541_for_iterator_2 local_160;
  anon_union_8_1_a8a14541_for_iterator_2 *local_158;
  anon_union_8_1_a8a14541_for_iterator_2 local_150;
  undefined8 uStack_148;
  string local_140;
  DescriptorBuilder *local_138;
  size_t local_130;
  char *local_128;
  anon_union_8_1_a8a14541_for_iterator_2 local_120;
  anon_union_8_1_a8a14541_for_iterator_2 local_118;
  anon_union_8_1_a8a14541_for_iterator_2 local_110;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined1 uStack_f0;
  undefined1 uStack_ef;
  undefined1 uStack_ee;
  undefined1 uStack_ed;
  undefined1 uStack_ec;
  undefined1 uStack_eb;
  undefined1 uStack_ea;
  undefined1 uStack_e9;
  Descriptor *local_e8;
  void **local_e0;
  void **local_d8;
  iterator local_d0;
  byte local_c0;
  VoidPtr local_b8;
  code *pcStack_b0;
  VoidPtr local_a8;
  code *pcStack_a0;
  VoidPtr local_98;
  code *pcStack_90;
  iterator local_88;
  char *local_78;
  long local_70;
  undefined1 local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined1 uStack_52;
  undefined1 uStack_51;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined1 local_48 [16];
  
  local_128 = message_name._M_str;
  local_130 = message_name._M_len;
  local_18c = (undefined4)CONCAT71(in_register_00000089,use_custom_names);
  local_188 = (undefined1  [16])0x0;
  local_178.heap.control =
       (ctrl_t *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  this_00 = &(message->field_0)._impl_.field_;
  local_138 = this;
  local_e8 = descriptor;
  ppvVar10 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  local_e0 = (void **)RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(this_00);
  bVar4 = (byte)local_18c;
  do {
    if (ppvVar10 == local_e0) {
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
      ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                       *)local_188);
      return;
    }
    aVar13.slot_ = (slot_type *)*ppvVar10;
    psVar11 = (size_t *)
              ((ulong)((anon_union_8_1_a8a14541_for_iterator_2 *)((long)aVar13.slot_ + 0x18))->slot_
              & 0xfffffffffffffffc);
    input._M_str = (char *)message;
    input._M_len = *psVar11;
    (anonymous_namespace)::ToJsonName_abi_cxx11_
              ((string *)&local_1b0,(_anonymous_namespace_ *)psVar11[1],input);
    if ((((byte)local_18c == '\0') ||
        ((undefined1  [80])((undefined1  [80])*(slot_type *)aVar13 & (undefined1  [80])0x10) ==
         (undefined1  [80])0x0)) ||
       (bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)((anon_union_8_1_a8a14541_for_iterator_2 *)
                                         ((long)aVar13.slot_ + 0x38))->slot_ & 0xfffffffffffffffc),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_1b0), !bVar5)) {
      local_158 = local_1a8;
      if (local_1b0.slot_ == (slot_type *)&local_1a0) {
        uStack_148 = uStack_198;
        local_160.slot_ = (slot_type *)&local_150;
      }
      else {
        local_160.slot_ = (slot_type *)local_1b0;
      }
      local_150.slot_ = (slot_type *)local_1a0;
      local_1a8 = (anon_union_8_1_a8a14541_for_iterator_2 *)0x0;
      local_1a0.slot_ = (slot_type *)((ulong)local_1a0.slot_ & 0xffffffffffffff00);
      sVar19 = (string)0x0;
      local_1b0.slot_ = (slot_type *)&local_1a0;
      local_168.slot_ = aVar13.slot_;
    }
    else {
      sVar19 = (string)0x1;
      local_168.slot_ = aVar13.slot_;
      std::__cxx11::string::string
                ((string *)&local_160,
                 (string *)
                 ((ulong)((anon_union_8_1_a8a14541_for_iterator_2 *)((long)aVar13.slot_ + 0x38))->
                         slot_ & 0xfffffffffffffffc));
    }
    local_140 = sVar19;
    std::__cxx11::string::~string((string *)&local_1b0);
    if (local_140 == (string)0x1) {
      std::__cxx11::string::string((string *)&local_78,(string *)&local_160);
      if ((local_70 == 0) || (*local_78 != '[')) {
        std::__cxx11::string::~string((string *)&local_78);
        goto LAB_001cb67d;
      }
      cVar6 = local_78[local_70 + -1];
      std::__cxx11::string::~string((string *)&local_78);
      if (cVar6 != ']') goto LAB_001cb67d;
      local_1a8 = &local_168;
      pcStack_90 = absl::lts_20240722::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
      ;
      local_98.obj = &local_1b0;
      element_name._M_str = local_128;
      element_name._M_len = local_130;
      make_error_00.invoker_ =
           absl::lts_20240722::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
      ;
      make_error_00.ptr_.obj = local_98.obj;
      local_1b0.slot_ = aVar13.slot_;
      AddError(local_138,element_name,(Message *)aVar13.slot_,NAME,make_error_00);
      message = (DescriptorProto *)aVar13;
    }
    else {
LAB_001cb67d:
      local_120.slot_ = aVar13.slot_;
      local_d8 = ppvVar10;
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
      ::AssertHashEqConsistent<std::__cxx11::string>
                ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                  *)local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160);
      v._M_str = (char *)local_160.slot_;
      v._M_len = (size_t)local_158;
      sVar12 = absl::lts_20240722::container_internal::StringHash::operator()
                         ((StringHash *)local_188,v);
      absl::lts_20240722::container_internal::probe
                ((probe_seq<16UL> *)&local_1b0,(CommonFields *)local_188,sVar12);
      uVar18 = local_178.heap.control;
      auVar23 = ZEXT216(CONCAT11((char)sVar12,(char)sVar12) & 0x7f7f);
      auVar23 = pshuflw(auVar23,auVar23,0);
      uVar22 = auVar23._0_4_;
      auVar23._4_4_ = uVar22;
      auVar23._0_4_ = uVar22;
      auVar23._8_4_ = uVar22;
      auVar23._12_4_ = uVar22;
      while( true ) {
        aVar13 = local_120;
        pcVar1 = (code *)(uVar18 + (long)local_1a8);
        auVar24[0] = -(auVar23[0] == *pcVar1);
        auVar24[1] = -(auVar23[1] == pcVar1[1]);
        auVar24[2] = -(auVar23[2] == pcVar1[2]);
        auVar24[3] = -(auVar23[3] == pcVar1[3]);
        auVar24[4] = -(auVar23[4] == pcVar1[4]);
        auVar24[5] = -(auVar23[5] == pcVar1[5]);
        auVar24[6] = -(auVar23[6] == pcVar1[6]);
        auVar24[7] = -(auVar23[7] == pcVar1[7]);
        auVar24[8] = -(auVar23[8] == pcVar1[8]);
        auVar24[9] = -(auVar23[9] == pcVar1[9]);
        auVar24[10] = -(auVar23[10] == pcVar1[10]);
        auVar24[0xb] = -(auVar23[0xb] == pcVar1[0xb]);
        auVar24[0xc] = -(auVar23[0xc] == pcVar1[0xc]);
        auVar24[0xd] = -(auVar23[0xd] == pcVar1[0xd]);
        auVar24[0xe] = -(auVar23[0xe] == pcVar1[0xe]);
        auVar24[0xf] = -(auVar23[0xf] == pcVar1[0xf]);
        cVar27 = *pcVar1;
        cVar30 = pcVar1[1];
        cVar31 = pcVar1[2];
        cVar32 = pcVar1[3];
        cVar33 = pcVar1[4];
        cVar34 = pcVar1[5];
        cVar35 = pcVar1[6];
        cVar36 = pcVar1[7];
        cVar37 = pcVar1[8];
        cVar38 = pcVar1[9];
        cVar39 = pcVar1[10];
        cVar40 = pcVar1[0xb];
        cVar41 = pcVar1[0xc];
        cVar42 = pcVar1[0xd];
        cVar43 = pcVar1[0xe];
        cVar44 = pcVar1[0xf];
        for (uVar7 = (ushort)(SUB161(auVar24 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar24[0xf] >> 7) << 0xf; uVar7 != 0; uVar7 = uVar7 - 1 & uVar7) {
          local_f8 = (code *)CONCAT17(cVar36,CONCAT16(cVar35,CONCAT15(cVar34,CONCAT14(cVar33,
                                                  CONCAT13(cVar32,CONCAT12(cVar31,CONCAT11(cVar30,
                                                  cVar27)))))));
          local_108 = auVar23;
          uStack_f0 = cVar37;
          uStack_ef = cVar38;
          uStack_ee = cVar39;
          uStack_ed = cVar40;
          uStack_ec = cVar41;
          uStack_eb = cVar42;
          uStack_ea = cVar43;
          uStack_e9 = cVar44;
          uVar8 = absl::lts_20240722::container_internal::TrailingZeros<unsigned_short>(uVar7);
          local_118.slot_ = (slot_type *)&local_160;
          message = (DescriptorProto *)local_188;
          local_110.slot_ = (slot_type *)message;
          bVar5 = absl::lts_20240722::container_internal::
                  hash_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,void>
                  ::
                  apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>::EqualElement<std::__cxx11::string>,std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>&,absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>>
                            ((EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_118,
                             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>
                              *)(((long)local_1a8 + (ulong)uVar8 & (ulong)local_1b0.slot_) * 0x50 +
                                (long)local_178.heap.slot_array));
          if (bVar5) {
            sVar12 = (long)local_1a8 + (ulong)uVar8 & (ulong)local_1b0.slot_;
            bVar15 = 0;
            goto LAB_001cb7da;
          }
          auVar23 = local_108;
          cVar27 = local_f8._0_1_;
          cVar30 = local_f8._1_1_;
          cVar31 = local_f8._2_1_;
          cVar32 = local_f8._3_1_;
          cVar33 = local_f8._4_1_;
          cVar34 = local_f8._5_1_;
          cVar35 = local_f8._6_1_;
          cVar36 = local_f8._7_1_;
          cVar37 = uStack_f0;
          cVar38 = uStack_ef;
          cVar39 = uStack_ee;
          cVar40 = uStack_ed;
          cVar41 = uStack_ec;
          cVar42 = uStack_eb;
          cVar43 = uStack_ea;
          cVar44 = uStack_e9;
        }
        auVar28[0] = -(cVar27 == (code)0x80);
        auVar28[1] = -(cVar30 == (code)0x80);
        auVar28[2] = -(cVar31 == (code)0x80);
        auVar28[3] = -(cVar32 == (code)0x80);
        auVar28[4] = -(cVar33 == (code)0x80);
        auVar28[5] = -(cVar34 == (code)0x80);
        auVar28[6] = -(cVar35 == (code)0x80);
        auVar28[7] = -(cVar36 == (code)0x80);
        auVar28[8] = -(cVar37 == (code)0x80);
        auVar28[9] = -(cVar38 == (code)0x80);
        auVar28[10] = -(cVar39 == (code)0x80);
        auVar28[0xb] = -(cVar40 == (code)0x80);
        auVar28[0xc] = -(cVar41 == (code)0x80);
        auVar28[0xd] = -(cVar42 == (code)0x80);
        auVar28[0xe] = -(cVar43 == (code)0x80);
        auVar28[0xf] = -(cVar44 == (code)0x80);
        uVar7 = (ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe | (ushort)(auVar28[0xf] >> 7) << 0xf;
        if (uVar7 != 0) break;
        aVar13.slot_ = (slot_type *)((long)local_1a0.slot_ + 0x10);
        local_1a8 = (anon_union_8_1_a8a14541_for_iterator_2 *)
                    ((long)local_1a8 + (long)((long)local_1a0.slot_ + 0x10) & (ulong)local_1b0.slot_
                    );
        local_1a0.slot_ = aVar13.slot_;
        if ((ulong)local_188._0_8_ < aVar13.slot_) {
          __assert_fail("seq.index() <= capacity() && \"full table!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xef5,
                        "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, K = std::basic_string<char>]"
                       );
        }
      }
      cVar6 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                        (local_188._0_8_,sVar12,local_178.heap.control);
      if (cVar6 == '\0') {
        uVar9 = absl::lts_20240722::container_internal::TrailingZeros<unsigned_short>(uVar7);
      }
      else {
        uVar2 = 0xf;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        uVar9 = (ushort)((uVar2 ^ 0xfff0) + 0x11) - 1;
      }
      FVar45.offset = (long)local_1a8 + (ulong)uVar9 & (ulong)local_1b0.slot_;
      FVar45.probe_length = (size_t)local_1a0.slot_;
      message = (DescriptorProto *)local_1a0;
      sVar12 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                         ((CommonFields *)local_188,sVar12,FVar45,
                          (PolicyFunctions *)
                          absl::lts_20240722::container_internal::
                          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                          ::GetPolicyFunctions()::value);
      bVar15 = 1;
      aVar13 = local_120;
LAB_001cb7da:
      iVar46 = absl::lts_20240722::container_internal::
               raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                              *)local_188,sVar12);
      aVar16 = iVar46.field_1;
      local_d0 = iVar46;
      local_c0 = bVar15;
      if (bVar15 != 0) {
        local_88 = iVar46;
        std::__cxx11::string::string((string *)aVar16.slot_,(string *)&local_160);
        *(anon_union_8_1_a8a14541_for_iterator_2 *)((long)aVar16.slot_ + 0x20) = local_168;
        std::__cxx11::string::string((string *)((long)aVar16.slot_ + 0x28),(string *)&local_160);
        *(string *)((long)aVar16.slot_ + 0x48) = local_140;
        aVar13.slot_ = (slot_type *)
                       absl::lts_20240722::container_internal::
                       raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                       ::iterator::operator*(&local_88);
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
        ::AssertHashEqConsistent<std::__cxx11::string>
                  ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
                    *)local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)aVar13.slot_
                  );
        v_00._M_str = (char *)*(slot_type **)aVar13.slot_;
        v_00._M_len = (size_t)((anon_union_8_1_a8a14541_for_iterator_2 *)((long)aVar13.slot_ + 8))->
                              slot_;
        sVar12 = absl::lts_20240722::container_internal::StringHash::operator()
                           ((StringHash *)local_188,v_00);
        absl::lts_20240722::container_internal::probe
                  ((probe_seq<16UL> *)&local_1b0,(CommonFields *)local_188,sVar12);
        uVar21 = sVar12 & 0xffffffffffffff7f;
        auVar23 = ZEXT416((CONCAT11((char)sVar12,(char)sVar12) & 0xff7f) & 0xffff7fff);
        auVar23 = pshuflw(auVar23,auVar23,0);
        uVar22 = auVar23._0_4_;
        auVar26._4_4_ = uVar22;
        auVar26._0_4_ = uVar22;
        auVar26._8_4_ = uVar22;
        auVar26._12_4_ = uVar22;
        uVar18 = local_178.heap.control;
        while( true ) {
          pcVar1 = (code *)(uVar18 + (long)local_1a8);
          auVar25[0] = -(auVar26[0] == *pcVar1);
          auVar25[1] = -(auVar26[1] == pcVar1[1]);
          auVar25[2] = -(auVar26[2] == pcVar1[2]);
          auVar25[3] = -(auVar26[3] == pcVar1[3]);
          auVar25[4] = -(auVar26[4] == pcVar1[4]);
          auVar25[5] = -(auVar26[5] == pcVar1[5]);
          auVar25[6] = -(auVar26[6] == pcVar1[6]);
          auVar25[7] = -(auVar26[7] == pcVar1[7]);
          auVar25[8] = -(auVar26[8] == pcVar1[8]);
          auVar25[9] = -(auVar26[9] == pcVar1[9]);
          auVar25[10] = -(auVar26[10] == pcVar1[10]);
          auVar25[0xb] = -(auVar26[0xb] == pcVar1[0xb]);
          auVar25[0xc] = -(auVar26[0xc] == pcVar1[0xc]);
          auVar25[0xd] = -(auVar26[0xd] == pcVar1[0xd]);
          auVar25[0xe] = -(auVar26[0xe] == pcVar1[0xe]);
          auVar25[0xf] = -(auVar26[0xf] == pcVar1[0xf]);
          uVar7 = (ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar25[0xf] >> 7) << 0xf;
          cVar27 = *pcVar1;
          cVar30 = pcVar1[1];
          cVar31 = pcVar1[2];
          cVar32 = pcVar1[3];
          cVar33 = pcVar1[4];
          cVar34 = pcVar1[5];
          cVar35 = pcVar1[6];
          cVar36 = pcVar1[7];
          cVar37 = pcVar1[8];
          cVar38 = pcVar1[9];
          cVar39 = pcVar1[10];
          cVar40 = pcVar1[0xb];
          cVar41 = pcVar1[0xc];
          cVar42 = pcVar1[0xd];
          cVar43 = pcVar1[0xe];
          cVar44 = pcVar1[0xf];
          while( true ) {
            pcVar20 = iVar46.ctrl_;
            if (uVar7 == 0) break;
            local_108._0_8_ = iVar46.field_1.slot_;
            local_f8 = (code *)uVar18;
            local_58 = cVar27;
            uStack_57 = cVar30;
            uStack_56 = cVar31;
            uStack_55 = cVar32;
            uStack_54 = cVar33;
            uStack_53 = cVar34;
            uStack_52 = cVar35;
            uStack_51 = cVar36;
            uStack_50 = cVar37;
            uStack_4f = cVar38;
            uStack_4e = cVar39;
            uStack_4d = cVar40;
            uStack_4c = cVar41;
            uStack_4b = cVar42;
            uStack_4a = cVar43;
            uStack_49 = cVar44;
            local_48 = auVar26;
            uVar8 = absl::lts_20240722::container_internal::TrailingZeros<unsigned_short>(uVar7);
            uVar21 = (ulong)uVar8;
            local_118.slot_ = aVar13.slot_;
            local_110.slot_ = (slot_type *)local_188;
            bVar5 = absl::lts_20240722::container_internal::
                    hash_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,void>
                    ::
                    apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>::EqualElement<std::__cxx11::string>,std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>&,absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>>
                              ((EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_118,
                               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>
                                *)(((long)local_1a8 + uVar21 & (ulong)local_1b0.slot_) * 0x50 +
                                  (long)local_178.heap.slot_array));
            if (bVar5) {
              iVar47 = absl::lts_20240722::container_internal::
                       raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                       ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                                      *)local_188,(long)local_1a8 + uVar21 & (ulong)local_1b0.slot_)
              ;
              iVar46.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)local_108._0_8_;
              iVar46.ctrl_ = pcVar20;
              goto LAB_001cb9e1;
            }
            uVar7 = uVar7 - 1 & uVar7;
            iVar46.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)local_108._0_8_;
            iVar46.ctrl_ = pcVar20;
            uVar18 = local_f8;
            auVar26 = local_48;
            cVar27 = local_58;
            cVar30 = uStack_57;
            cVar31 = uStack_56;
            cVar32 = uStack_55;
            cVar33 = uStack_54;
            cVar34 = uStack_53;
            cVar35 = uStack_52;
            cVar36 = uStack_51;
            cVar37 = uStack_50;
            cVar38 = uStack_4f;
            cVar39 = uStack_4e;
            cVar40 = uStack_4d;
            cVar41 = uStack_4c;
            cVar42 = uStack_4b;
            cVar43 = uStack_4a;
            cVar44 = uStack_49;
          }
          auVar29[0] = -(cVar27 == (code)0x80);
          auVar29[1] = -(cVar30 == (code)0x80);
          auVar29[2] = -(cVar31 == (code)0x80);
          auVar29[3] = -(cVar32 == (code)0x80);
          auVar29[4] = -(cVar33 == (code)0x80);
          auVar29[5] = -(cVar34 == (code)0x80);
          auVar29[6] = -(cVar35 == (code)0x80);
          auVar29[7] = -(cVar36 == (code)0x80);
          auVar29[8] = -(cVar37 == (code)0x80);
          auVar29[9] = -(cVar38 == (code)0x80);
          auVar29[10] = -(cVar39 == (code)0x80);
          auVar29[0xb] = -(cVar40 == (code)0x80);
          auVar29[0xc] = -(cVar41 == (code)0x80);
          auVar29[0xd] = -(cVar42 == (code)0x80);
          auVar29[0xe] = -(cVar43 == (code)0x80);
          auVar29[0xf] = -(cVar44 == (code)0x80);
          if ((((((((((((((((auVar29 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar29 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar29 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar29 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar29 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar29 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar29 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar29 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar29 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar29 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar29 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              cVar44 == (code)0x80) break;
          aVar16.slot_ = (slot_type *)((long)local_1a0.slot_ + 0x10);
          local_1a8 = (anon_union_8_1_a8a14541_for_iterator_2 *)
                      ((long)local_1a8 + (long)((long)local_1a0.slot_ + 0x10) &
                      (ulong)local_1b0.slot_);
          local_1a0.slot_ = aVar16.slot_;
          if ((ulong)local_188._0_8_ < aVar16.slot_) {
            __assert_fail("seq.index() <= capacity() && \"full table!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xdbd,
                          "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, K = std::basic_string<char>]"
                         );
          }
        }
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar21;
        iVar47 = (iterator)(auVar3 << 0x40);
LAB_001cb9e1:
        pcVar20 = iVar46.ctrl_;
        ctrl = iVar47.ctrl_;
        absl::lts_20240722::container_internal::AssertIsValidForComparison
                  (ctrl,'\0',(GenerationType *)0x0);
        absl::lts_20240722::container_internal::AssertIsValidForComparison
                  (pcVar20,'\0',(GenerationType *)0x0);
        message = (DescriptorProto *)&local_118;
        local_1b0 = iVar47.field_1;
        local_118 = iVar46.field_1;
        absl::lts_20240722::container_internal::AssertSameContainer
                  (ctrl,pcVar20,&local_1b0.slot_,(void **)&local_118,(GenerationType *)0x0,
                   (GenerationType *)0x0);
        aVar13 = local_120;
        if (ctrl != pcVar20) {
          __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xf3f,
                        "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::(anonymous namespace)::JsonNameDetails>>, Args = <const std::piecewise_construct_t &, std::tuple<const std::basic_string<char> &>, std::tuple<google::protobuf::(anonymous namespace)::JsonNameDetails &>>]"
                       );
        }
      }
      ppvVar10 = local_d8;
      if ((local_c0 & 1) == 0) {
        pcVar17 = "operator->";
        absl::lts_20240722::container_internal::AssertIsFull
                  (local_d0.ctrl_,'\0',(GenerationType *)0x0,"operator->");
        ppVar14 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
                  ::iterator::operator*(&local_d0);
        message._1_7_ = (undefined7)((ulong)pcVar17 >> 8);
        message._0_1_ = local_140;
        if (((bVar4 ^ 1 | (byte)local_140) & 1) == 0) {
          if ((ppVar14->second).is_custom == false) goto LAB_001cbb69;
          bVar15 = 0;
        }
        else {
          bVar15 = (byte)local_140 | (byte)local_18c;
        }
        local_1a8 = (anon_union_8_1_a8a14541_for_iterator_2 *)&ppVar14->second;
        local_1b0.slot_ = (slot_type *)&local_168;
        local_1a0 = aVar13;
        if (((local_e8->merged_features_->field_0)._impl_.json_format_ == 2) &&
           ((bVar15 & (ppVar14->second).is_custom & 1) == 0)) {
          pcStack_a0 = absl::lts_20240722::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
          ;
          local_a8.obj = &local_1b0;
          element_name_00._M_str = local_128;
          element_name_00._M_len = local_130;
          make_error_01.invoker_ =
               absl::lts_20240722::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
          ;
          make_error_01.ptr_.obj = local_a8.obj;
          AddWarning(local_138,element_name_00,(Message *)aVar13.slot_,NAME,make_error_01);
          message = (DescriptorProto *)aVar13;
        }
        else {
          pcStack_b0 = absl::lts_20240722::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
          ;
          local_b8.obj = &local_1b0;
          element_name_01._M_str = local_128;
          element_name_01._M_len = local_130;
          make_error_02.invoker_ =
               absl::lts_20240722::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
          ;
          make_error_02.ptr_.obj = local_b8.obj;
          AddError(local_138,element_name_01,(Message *)aVar13.slot_,NAME,make_error_02);
          message = (DescriptorProto *)aVar13;
        }
      }
    }
LAB_001cbb69:
    std::__cxx11::string::~string((string *)&local_160);
    ppvVar10 = ppvVar10 + 1;
  } while( true );
}

Assistant:

void DescriptorBuilder::CheckFieldJsonNameUniqueness(
    const absl::string_view message_name, const DescriptorProto& message,
    const Descriptor* descriptor, bool use_custom_names) {
  absl::flat_hash_map<std::string, JsonNameDetails> name_to_field;
  for (const FieldDescriptorProto& field : message.field()) {
    JsonNameDetails details = GetJsonNameDetails(&field, use_custom_names);
    if (details.is_custom && JsonNameLooksLikeExtension(details.orig_name)) {
      auto make_error = [&] {
        return absl::StrFormat(
            "The custom JSON name of field \"%s\" (\"%s\") is invalid: "
            "JSON names may not start with '[' and end with ']'.",
            field.name(), details.orig_name);
      };
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
      continue;
    }
    auto it_inserted = name_to_field.try_emplace(details.orig_name, details);
    if (it_inserted.second) {
      continue;
    }
    JsonNameDetails& match = it_inserted.first->second;
    if (use_custom_names && !details.is_custom && !match.is_custom) {
      // if this pass is considering custom JSON names, but neither of the
      // names involved in the conflict are custom, don't bother with a
      // message. That will have been reported from other pass (non-custom
      // JSON names).
      continue;
    }
    auto make_error = [&] {
      absl::string_view this_type = details.is_custom ? "custom" : "default";
      absl::string_view existing_type = match.is_custom ? "custom" : "default";
      // If the matched name differs (which it can only differ in case), include
      // it in the error message, for maximum clarity to user.
      std::string name_suffix = "";
      if (details.orig_name != match.orig_name) {
        name_suffix = absl::StrCat(" (\"", match.orig_name, "\")");
      }
      return absl::StrFormat(
          "The %s JSON name of field \"%s\" (\"%s\") conflicts "
          "with the %s JSON name of field \"%s\"%s.",
          this_type, field.name(), details.orig_name, existing_type,
          match.field->name(), name_suffix);
    };

    bool involves_default = !details.is_custom || !match.is_custom;
    if (descriptor->features().json_format() ==
            FeatureSet::LEGACY_BEST_EFFORT &&
        involves_default) {
      // TODO Upgrade this to an error once downstream protos
      // have been fixed.
      AddWarning(message_name, field, DescriptorPool::ErrorCollector::NAME,
                 make_error);
    } else {
      AddError(message_name, field, DescriptorPool::ErrorCollector::NAME,
               make_error);
    }
  }
}